

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sampleSetRowid(sqlite3 *db,Stat4Sample *p,int n,u8 *pData)

{
  u8 *puVar1;
  u8 *pData_local;
  int n_local;
  Stat4Sample *p_local;
  sqlite3 *db_local;
  
  if (p->nRowid != 0) {
    sqlite3DbFree(db,(p->u).aRowid);
  }
  puVar1 = (u8 *)sqlite3DbMallocRawNN(db,(long)n);
  (p->u).aRowid = puVar1;
  if ((p->u).iRowid == 0) {
    p->nRowid = 0;
  }
  else {
    p->nRowid = n;
    memcpy((p->u).aRowid,pData,(long)n);
  }
  return;
}

Assistant:

static void sampleSetRowid(sqlite3 *db, Stat4Sample *p, int n, const u8 *pData){
  assert( db!=0 );
  if( p->nRowid ) sqlite3DbFree(db, p->u.aRowid);
  p->u.aRowid = sqlite3DbMallocRawNN(db, n);
  if( p->u.aRowid ){
    p->nRowid = n;
    memcpy(p->u.aRowid, pData, n);
  }else{
    p->nRowid = 0;
  }
}